

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O2

int user_callback_handle_rxflow
              (lws_callback_function *callback_function,lws *wsi,lws_callback_reasons reason,
              void *user,void *in,size_t len)

{
  int iVar1;
  
  wsi->field_0x2df = wsi->field_0x2df | 0x80;
  iVar1 = (*callback_function)(wsi,reason,user,in,len);
  wsi->field_0x2df = wsi->field_0x2df & 0x7f;
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = __lws_rx_flow_control(wsi);
  return iVar1;
}

Assistant:

int user_callback_handle_rxflow(lws_callback_function callback_function,
				struct lws *wsi,
				enum lws_callback_reasons reason, void *user,
				void *in, size_t len)
{
	int n;

	wsi->rxflow_will_be_applied = 1;
	n = callback_function(wsi, reason, user, in, len);
	wsi->rxflow_will_be_applied = 0;
	if (!n)
		n = __lws_rx_flow_control(wsi);

	return n;
}